

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_statemach_act(connectdata *conn)

{
  _Bool local_51;
  size_t local_48;
  size_t nread;
  pingpong *pp;
  smtp_conn *smtpc;
  Curl_easy *pCStack_28;
  int smtpcode;
  Curl_easy *data;
  curl_socket_t sock;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data._0_4_ = conn->sock[0];
  pCStack_28 = conn->data;
  nread = (size_t)&conn->proto;
  local_48 = 0;
  pp = (pingpong *)nread;
  _sock = conn;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE) {
    conn_local._4_4_ = smtp_perform_upgrade_tls(conn);
  }
  else if ((conn->proto).ftpc.pp.sendleft == 0) {
    do {
      data._4_4_ = Curl_pp_readresp((curl_socket_t)data,(pingpong *)nread,(int *)((long)&smtpc + 4),
                                    &local_48);
      if (data._4_4_ != CURLE_OK) {
        return data._4_4_;
      }
      if ((*(int *)&pp[1].cache != 0xc) && (smtpc._4_4_ != 1)) {
        (pCStack_28->info).httpcode = smtpc._4_4_;
      }
      if (smtpc._4_4_ == 0) break;
      switch(*(undefined4 *)&pp[1].cache) {
      case 1:
        data._4_4_ = smtp_state_servergreet_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 2:
        data._4_4_ = smtp_state_ehlo_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 3:
        data._4_4_ = smtp_state_helo_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 4:
        data._4_4_ = smtp_state_starttls_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 6:
        data._4_4_ = smtp_state_auth_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 7:
        data._4_4_ = smtp_state_command_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 8:
        data._4_4_ = smtp_state_mail_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 9:
        data._4_4_ = smtp_state_rcpt_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 10:
        data._4_4_ = smtp_state_data_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0xb:
        data._4_4_ = smtp_state_postdata_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0xc:
      default:
        state(_sock,SMTP_STOP);
      }
      local_51 = false;
      if ((data._4_4_ == CURLE_OK) && (local_51 = false, *(int *)&pp[1].cache != 0)) {
        local_51 = Curl_pp_moredata((pingpong *)nread);
      }
    } while (local_51 != false);
    conn_local._4_4_ = data._4_4_;
  }
  else {
    conn_local._4_4_ = Curl_pp_flushsend((pingpong *)nread);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}